

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::~CommandStringParser
          (CommandStringParser *this)

{
  pointer pcVar1;
  pointer ppcVar2;
  
  (this->super_CommandLineParser).super_OptionParser._vptr_OptionParser =
       (_func_int **)&PTR__CommandStringParser_0012c838;
  pcVar1 = (this->tok_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->tok_).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_CommandLineParser).super_OptionParser._vptr_OptionParser =
       (_func_int **)&PTR__CommandLineParser_0012c808;
  ppcVar2 = (this->super_CommandLineParser).remaining.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

CommandStringParser(const char* cmd, ParseContext& ctx, unsigned flags)
		: CommandLineParser(ctx, flags)
		, cmd_(cmd ? cmd : "") {
		tok_.reserve(80);
	}